

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9_rle.h
# Opt level: O1

int32_t FastPForLib::Simple9_Codec::Compress
                  (uint32_t *input,int32_t inOffset,uint32_t inCount,uint32_t *output,
                  int32_t outOffset)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar8;
  
  uVar4 = inCount + inOffset;
  uVar10 = outOffset;
  uVar14 = outOffset;
  if ((uint)inOffset < uVar4) {
    do {
      uVar14 = uVar4 - inOffset;
      lVar13 = 0;
      uVar3 = 0;
      do {
        uVar2 = (&Simple9_Codec_intNumber)[lVar13];
        if (uVar14 <= (uint)(&Simple9_Codec_intNumber)[lVar13]) {
          uVar2 = uVar14;
        }
        uVar12 = lVar13 << 0x1c;
        if (uVar2 == 0) {
          uVar8 = 0;
        }
        else {
          uVar5 = 0;
          uVar7 = 0;
          do {
            uVar6 = input[(uint)(inOffset + (int)uVar7)];
            uVar1 = (&Simple9_Codec_bitLength)[lVar13] & 0x1f;
            uVar11 = uVar6 << (uVar5 & 0x1f);
            if (uVar6 >> uVar1 != 0) {
              uVar11 = 0;
            }
            uVar12 = (ulong)(uVar11 | (uint)uVar12);
            uVar8 = uVar7;
            if (uVar6 >> uVar1 != 0) break;
            uVar7 = uVar7 + 1;
            uVar5 = uVar5 + (&Simple9_Codec_bitLength)[lVar13];
            uVar8 = (ulong)uVar2;
          } while (uVar2 != uVar7);
        }
        uVar6 = (uint)uVar8;
        uVar5 = 0;
        if (uVar6 == uVar2) {
          uVar5 = uVar2;
        }
        inOffset = inOffset + uVar5;
        if (uVar6 == uVar2) {
          uVar3 = uVar12 & 0xffffffff;
        }
        uVar9 = (uint32_t)uVar3;
        if (uVar6 == uVar2) goto LAB_00127fb2;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 8);
      lVar13 = 8;
LAB_00127fb2:
      if ((int)lVar13 == 8) {
        uVar3 = (ulong)(uint)inOffset;
        inOffset = inOffset + 1;
        uVar9 = input[uVar3] | 0x80000000;
      }
      uVar14 = uVar10 + 1;
      output[uVar10] = uVar9;
      uVar10 = uVar14;
    } while ((uint)inOffset < uVar4);
  }
  return uVar14 - outOffset;
}

Assistant:

static int32_t Compress(const uint32_t *input, int32_t inOffset,
                          uint32_t inCount, uint32_t *output,
                          int32_t outOffset) {
    uint32_t inPos = inOffset;
    uint32_t inEnd = inOffset + inCount;
    uint32_t outPos = outOffset;

    while (inPos < inEnd) {
      uint32_t remainingCount = inEnd - inPos;
      uint32_t outVal = 0;

#if defined(_SIMPLE9_USE_RLE)
      // try if run-length encoding packs better than bit packing
      uint32_t repeatCount = tryRunLength(input, inPos, remainingCount);
      if (repeatCount > 0) {
        repeatCount = (repeatCount < RLE_MAX_COUNT_MASK) ? repeatCount
                                                         : RLE_MAX_COUNT_MASK;
        outVal = (RLE_SELECTOR_VALUE << SIMPLE9_BITSIZE) |
                 (repeatCount << RLE_MAX_VALUE_BITS) | input[inPos];
        inPos += repeatCount;
      } else
#endif
      {
        // try all the bit packing possibilities
        uint32_t code = SIMPLE9_MINCODE;
        for (; code < SIMPLE9_MAXCODE; code++) {
          uint32_t intNum = Simple9_Codec_intNumber[code];
          uint32_t bitLen = Simple9_Codec_bitLength[code];
          intNum = (intNum < remainingCount) ? intNum : remainingCount;

          uint32_t maxVal = (1U << bitLen) - 1;
          uint32_t val = code << SIMPLE9_BITSIZE;
          uint32_t j = 0;
          for (; j < intNum; j++) {
            uint32_t inputVal = input[inPos + j];
            if (inputVal > maxVal) {
              break;
            }
            val |= inputVal << (j * bitLen);
          }
          if (j == intNum) {
            outVal = val;
            inPos += intNum;
            break;
          }
        }
        // if no bit packing possible, encode just one value (up to INT_MAX)
        if (code == SIMPLE9_MAXCODE) {
          outVal = (code << SIMPLE9_BITSIZE) | input[inPos++];
        }
      }
      output[outPos++] = outVal;
    }
    return outPos - outOffset;
  }